

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase176::run(TestCase176 *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  undefined8 uVar3;
  long *plVar4;
  size_t sVar5;
  undefined8 uVar6;
  char (*pacVar7) [4];
  __pid_t _Var8;
  _func_int **pp_Var9;
  WeakFulfiller<void> *pWVar10;
  void *pvVar11;
  int *in_RCX;
  ulong uVar12;
  String *params_1;
  TransformPromiseNodeBase *pTVar13;
  char *pcVar14;
  OwnPromiseNode intermediate_1;
  char receiveBuffer [4];
  PromiseFulfillerPair<void> ready;
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  OwnPromiseNode intermediate;
  String path;
  String result;
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  AsyncIoContext ioContext;
  OwnPromiseNode local_178;
  OwnPromiseNode local_170;
  undefined1 local_164 [4];
  OwnPromiseNode local_160;
  OwnPromiseNode local_158;
  OwnPromiseNode local_150;
  TransformPromiseNodeBase *local_148;
  undefined1 local_140 [16];
  WeakFulfiller<void> *local_130;
  undefined1 local_128 [8];
  long *plStack_120;
  _func_int *local_118;
  long *plStack_110;
  _func_int *local_108;
  long *plStack_100;
  String local_f8;
  undefined1 local_d8 [32];
  String local_b8;
  DebugComparison<const_char_(&)[4],_kj::String_&> local_a0;
  undefined8 *local_78;
  long *local_70;
  undefined8 *local_68;
  long *local_60;
  char *local_48;
  char *pcStack_40;
  byte local_38 [8];
  
  setupAsyncIo();
  pp_Var9 = (_func_int **)(**(code **)(*local_60 + 0x18))();
  _Var8 = getpid();
  local_a0.left = (char (*) [4])CONCAT44(local_a0.left._4_4_,_Var8);
  str<char_const(&)[23],int>
            ((String *)local_d8,(kj *)"/tmp/kj-async-io-test.",(char (*) [23])&local_a0,in_RCX);
  local_108 = (_func_int *)0x0;
  plStack_100 = (long *)0x0;
  local_118 = (_func_int *)0x0;
  plStack_110 = (long *)0x0;
  local_128 = (undefined1  [8])0x0;
  plStack_120 = (long *)0x0;
  local_164[0] = '\0';
  local_164[1] = '\0';
  local_164[2] = '\0';
  local_164[3] = '\0';
  pWVar10 = (WeakFulfiller<void> *)operator_new(0x18);
  (pWVar10->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar10->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00605058;
  (pWVar10->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00605090;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_a0,pWVar10);
  pacVar7 = local_a0.left;
  local_140._0_8_ = local_a0.left;
  pPVar1 = *(PromiseArena **)((long)local_a0.left + 8);
  local_140._8_8_ = &pWVar10->super_WeakFulfillerBase;
  local_130 = pWVar10;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a0.left - (long)pPVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,(OwnPromiseNode *)local_140,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:191:22)>
               ::anon_class_16_2_cd6ceaae_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0060d138;
    *(_func_int ***)((long)pvVar11 + 0x3f0) = pp_Var9;
    *(PromiseArena **)((long)pvVar11 + 0x3f8) = (PromiseArena *)local_d8;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    *(PromiseArena **)((long)local_a0.left + 8) = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)((long)local_a0.left + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,(OwnPromiseNode *)local_140,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:191:22)>
               ::anon_class_16_2_cd6ceaae_for_func::operator());
    ((PromiseArenaMember *)((long)pacVar7 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060d138;
    ((PromiseArenaMember *)((long)pacVar7 + -0x10))->_vptr_PromiseArenaMember = pp_Var9;
    ((PromiseArenaMember *)((long)pacVar7 + -0x10))->arena = (PromiseArena *)local_d8;
    ((PromiseArenaMember *)((long)pacVar7 + -0x30))->arena = pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_f8.content.ptr = (char *)pTVar13;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_b8,(OwnPromiseNode *)&local_f8,(SourceLocation *)&local_a0);
  pcVar14 = local_f8.content.ptr;
  local_178.ptr = (PromiseNode *)local_b8.content.ptr;
  if ((TransformPromiseNodeBase *)local_f8.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar14);
  }
  OVar2.ptr = local_178.ptr;
  pPVar1 = ((local_178.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_178.ptr - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_178,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:193:11)>
               ::anon_class_8_1_5036e509_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0060d1e8;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_128;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    ((local_178.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)&local_178.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_178,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:193:11)>
               ::anon_class_8_1_5036e509_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060d1e8;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_128;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_f8.content.ptr = (char *)pTVar13;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_b8,(OwnPromiseNode *)&local_f8,(SourceLocation *)&local_a0);
  pcVar14 = local_f8.content.ptr;
  local_170.ptr = (PromiseNode *)local_b8.content.ptr;
  if ((TransformPromiseNodeBase *)local_f8.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar14);
  }
  OVar2.ptr = local_170.ptr;
  pPVar1 = ((local_170.ptr)->super_PromiseArenaMember).arena;
  uVar12 = (long)local_170.ptr - (long)pPVar1;
  params_1 = (String *)CONCAT71((int7)(uVar12 >> 8),0x27 < uVar12);
  if (pPVar1 != (PromiseArena *)0x0 && 0x27 < uVar12) {
    ((local_170.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)&local_170.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_170,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:214:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060d240;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  else {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_170,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:214:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0060d240;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  local_a0.left = (char (*) [4])pTVar13;
  kj::_::detach((Promise<void> *)&local_a0);
  pacVar7 = local_a0.left;
  if ((TransformPromiseNodeBase *)local_a0.left != (TransformPromiseNodeBase *)0x0) {
    local_a0.left = (char (*) [4])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pacVar7);
  }
  OVar2.ptr = local_170.ptr;
  if (&(local_170.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_170.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_178.ptr;
  if (&(local_178.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  str<char_const(&)[6],kj::String&>(&local_f8,(kj *)"unix:",(char (*) [6])local_d8,params_1);
  pTVar13 = (TransformPromiseNodeBase *)local_f8.content.ptr;
  if (local_f8.content.size_ == 0) {
    pTVar13 = (TransformPromiseNodeBase *)0x4b4903;
  }
  (**(code **)*pp_Var9)
            (&local_160,pp_Var9,pTVar13,local_f8.content.size_ + (local_f8.content.size_ == 0),0);
  OVar2.ptr = local_160.ptr;
  pPVar1 = ((local_160.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_160.ptr - (long)pPVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_160,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:219:13)>
               ::anon_class_16_2_1cb5feba_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0060d298;
    *(_func_int ***)((long)pvVar11 + 0x3f0) = &local_108;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_140;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    ((local_160.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)(local_160.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_160,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:219:13)>
               ::anon_class_16_2_1cb5feba_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060d298;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = &local_108;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_140;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_178.ptr = &pTVar13->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_170,&local_178,(SourceLocation *)&local_a0);
  OVar2.ptr = local_178.ptr;
  local_158.ptr = local_170.ptr;
  if ((TransformPromiseNodeBase *)local_178.ptr != (TransformPromiseNodeBase *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_158.ptr;
  pPVar1 = ((local_158.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_158.ptr - (long)pPVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_158,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:223:11)>
               ::anon_class_16_2_f6449cab_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0060d2f0;
    *(_func_int ***)((long)pvVar11 + 0x3f0) = &local_118;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_164;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    ((local_158.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)(local_158.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_158,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:223:11)>
               ::anon_class_16_2_f6449cab_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060d2f0;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = &local_118;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_164;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_a0.left = (char (*) [4])&DAT_0048a171;
  local_a0.right = (String *)&DAT_0048a1d0;
  local_a0.op.content.ptr = &DAT_4c0000058b;
  local_178.ptr = &pTVar13->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_170,&local_178,(SourceLocation *)&local_a0);
  OVar2.ptr = local_178.ptr;
  local_150.ptr = local_170.ptr;
  if ((TransformPromiseNodeBase *)local_178.ptr != (TransformPromiseNodeBase *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_150.ptr;
  pPVar1 = ((local_150.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_150.ptr - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_150,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:241:11)>
               ::anon_class_8_1_2dcb5b23_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_0060d348;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = local_164;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    ((local_150.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)&local_150.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,&local_150,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:241:11)>
               ::anon_class_8_1_2dcb5b23_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060d348;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_164;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_40 = "run";
  local_38[0] = 0xda;
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\x17';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_148 = pTVar13;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_b8,&local_148);
  pTVar13 = local_148;
  if (local_148 != (TransformPromiseNodeBase *)0x0) {
    local_148 = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar13);
  }
  OVar2.ptr = local_150.ptr;
  if (&(local_150.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_150.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_158.ptr;
  if (&(local_158.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_158.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_160.ptr;
  if (&(local_160.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_160.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  sVar5 = local_f8.content.size_;
  pcVar14 = local_f8.content.ptr;
  if ((TransformPromiseNodeBase *)local_f8.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar14,1,sVar5,sVar5,0);
  }
  local_f8.content.ptr = "foo";
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_a0,(DebugExpression<char_const(&)[4]> *)&local_f8,&local_b8);
  if ((local_a0.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",&local_a0,
               (char (*) [4])0x4d8ac4,&local_b8);
  }
  sVar5 = local_b8.content.size_;
  pcVar14 = local_b8.content.ptr;
  if ((PromiseArenaMember *)local_b8.content.ptr != (PromiseArenaMember *)0x0) {
    local_b8.content.ptr = (char *)0x0;
    local_b8.content.size_ = 0;
    (**(local_b8.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.content.disposer,pcVar14,1,sVar5,sVar5,0);
  }
  pWVar10 = local_130;
  if (local_130 != (WeakFulfiller<void> *)0x0) {
    local_130 = (WeakFulfiller<void> *)0x0;
    (**((Disposer *)local_140._8_8_)->_vptr_Disposer)
              (local_140._8_8_,
               (pWVar10->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector
               [-2] + (long)&(pWVar10->super_PromiseFulfiller<void>).super_PromiseRejector.
                             _vptr_PromiseRejector);
  }
  uVar3 = local_140._0_8_;
  if ((PromiseArenaMember *)local_140._0_8_ != (PromiseArenaMember *)0x0) {
    local_140._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  plVar4 = plStack_120;
  if (plStack_120 != (long *)0x0) {
    plStack_120 = (long *)0x0;
    (*(code *)**(undefined8 **)local_128)(local_128,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = plStack_110;
  if (plStack_110 != (long *)0x0) {
    plStack_110 = (long *)0x0;
    (*(code *)**(undefined8 **)local_118)(local_118,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = plStack_100;
  if (plStack_100 != (long *)0x0) {
    plStack_100 = (long *)0x0;
    (*(code *)**(undefined8 **)local_108)(local_108,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  pcVar14 = (char *)local_d8._0_8_;
  if (local_d8._8_8_ == 0) {
    pcVar14 = "";
  }
  unlink(pcVar14);
  uVar6 = local_d8._8_8_;
  uVar3 = local_d8._0_8_;
  if ((char *)local_d8._0_8_ != (char *)0x0) {
    local_d8._0_8_ = (char *)0x0;
    local_d8._8_8_ = 0;
    (*(code *)**(undefined8 **)local_d8._16_8_)(local_d8._16_8_,uVar3,1,uVar6,uVar6,0);
  }
  plVar4 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (**(code **)*local_68)(local_68,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = local_70;
  if (local_70 != (long *)0x0) {
    local_70 = (long *)0x0;
    (**(code **)*local_78)(local_78,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, UnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  auto path = kj::str(TMPDIR "/kj-async-io-test.", getpid());
  KJ_DEFER(unlink(path.cStr()));

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto ready = newPromiseAndFulfiller<void>();

  ready.promise.then([&]() {
    return network.parseAddress(kj::str("unix:", path));
  }).then([&](Own<NetworkAddress>&& addr) {
    auto promise = addr->connectAuthenticated();
    return promise.then([&,addr=kj::mv(addr)](AuthenticatedStream result) mutable {
      auto id = result.peerIdentity.downcast<LocalPeerIdentity>();
      auto creds = id->getCredentials();
      KJ_IF_SOME(p, creds.pid) {
        KJ_EXPECT(p == getpid());
#if __linux__ || __APPLE__
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null PID");
#endif
      }
      KJ_IF_SOME(u, creds.uid) {
        KJ_EXPECT(u == getuid());
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null UID");
      }

      client = kj::mv(result.stream);
      return client->write("foo"_kjb);
    });
  }